

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

char * ngx_conf_set_access_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  char *__s1;
  int iVar2;
  ulong *puVar3;
  ulong local_68;
  ngx_uint_t user;
  ngx_uint_t *access;
  ngx_uint_t shift;
  ngx_uint_t right;
  ngx_uint_t i;
  ngx_str_t *value;
  u_char *p;
  char *confp;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  puVar3 = (ulong *)((long)conf + cmd->offset);
  if (*puVar3 == 0xffffffffffffffff) {
    pvVar1 = cf->args->elts;
    *puVar3 = 0;
    local_68 = 0x180;
    for (right = 1; right < cf->args->nelts; right = right + 1) {
      __s1 = *(char **)((long)pvVar1 + right * 0x10 + 8);
      iVar2 = strncmp(__s1,"user:",5);
      if (iVar2 == 0) {
        access._0_1_ = 6;
        value = (ngx_str_t *)(__s1 + 5);
        local_68 = 0;
      }
      else {
        iVar2 = strncmp(__s1,"group:",6);
        if (iVar2 == 0) {
          access._0_1_ = 3;
          value = (ngx_str_t *)(__s1 + 6);
        }
        else {
          iVar2 = strncmp(__s1,"all:",4);
          if (iVar2 != 0) goto LAB_001234f1;
          access._0_1_ = 0;
          value = (ngx_str_t *)(__s1 + 4);
        }
      }
      iVar2 = strcmp((char *)value,"rw");
      if (iVar2 == 0) {
        shift = 6;
      }
      else {
        iVar2 = strcmp((char *)value,"r");
        if (iVar2 != 0) {
LAB_001234f1:
          ngx_conf_log_error(1,cf,0,"invalid value \"%V\"",(void *)((long)pvVar1 + right * 0x10));
          return (char *)0xffffffffffffffff;
        }
        shift = 4;
      }
      *puVar3 = shift << (sbyte)access | *puVar3;
    }
    *puVar3 = local_68 | *puVar3;
    cf_local = (ngx_conf_t *)0x0;
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

char *
ngx_conf_set_access_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *confp = conf;

    u_char      *p;
    ngx_str_t   *value;
    ngx_uint_t   i, right, shift, *access, user;

    access = (ngx_uint_t *) (confp + cmd->offset);

    if (*access != NGX_CONF_UNSET_UINT) {
        return "is duplicate";
    }

    value = cf->args->elts;

    *access = 0;
    user = 0600;

    for (i = 1; i < cf->args->nelts; i++) {

        p = value[i].data;

        if (ngx_strncmp(p, "user:", sizeof("user:") - 1) == 0) {
            shift = 6;
            p += sizeof("user:") - 1;
            user = 0;

        } else if (ngx_strncmp(p, "group:", sizeof("group:") - 1) == 0) {
            shift = 3;
            p += sizeof("group:") - 1;

        } else if (ngx_strncmp(p, "all:", sizeof("all:") - 1) == 0) {
            shift = 0;
            p += sizeof("all:") - 1;

        } else {
            goto invalid;
        }

        if (ngx_strcmp(p, "rw") == 0) {
            right = 6;

        } else if (ngx_strcmp(p, "r") == 0) {
            right = 4;

        } else {
            goto invalid;
        }

        *access |= right << shift;
    }

    *access |= user;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid value \"%V\"", &value[i]);

    return NGX_CONF_ERROR;
}